

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(Registry *this,uint64_t aXpan)

{
  Status SVar1;
  Network nwk;
  Network NStack_78;
  
  Network::Network(&NStack_78);
  SVar1 = GetNetworkByXpan(this,aXpan,&NStack_78);
  if (SVar1 == kSuccess) {
    SVar1 = SetCurrentNetwork(this,&NStack_78.mId);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)NStack_78.mMlp._M_dataplus._M_p != &NStack_78.mMlp.field_2) {
    operator_delete(NStack_78.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)NStack_78.mName._M_dataplus._M_p != &NStack_78.mName.field_2) {
    operator_delete(NStack_78.mName._M_dataplus._M_p);
  }
  return SVar1;
}

Assistant:

Registry::Status Registry::SetCurrentNetwork(uint64_t aXpan)
{
    Network          nwk;
    Registry::Status status;

    VerifyOrExit((status = GetNetworkByXpan(aXpan, nwk)) == Registry::Status::kSuccess);
    status = SetCurrentNetwork(nwk.mId);
exit:
    return status;
}